

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall TextReaderTest_ReportError_Test::TestBody(TextReaderTest_ReportError_Test *this)

{
  bool bVar1;
  char *message;
  NLStringRef data;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  TextReader reader;
  AssertHelper local_d0;
  AssertionResult local_c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8 [2];
  long local_a8 [2];
  undefined8 local_98 [2];
  ArgList local_88;
  TextReader<fmt::Locale> local_78;
  
  data.size_ = 2;
  data.data_ = "x\n";
  mp::internal::TextReader<fmt::Locale>::TextReader(&local_78,data,(CStringRef)0x27a539);
  testing::AssertionSuccess();
  if (local_c8.success_ == true) {
    local_b8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"test:1:1: abc","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_88.field_1.values_ = (Value *)local_98;
      local_98[0] = 0x62;
      local_88.types_ = 7;
      mp::internal::TextReader<fmt::Locale>::DoReportError
                (&local_78,local_78.super_ReaderBase.token_,(CStringRef)0x25c7ce,&local_88);
    }
    testing::AssertionResult::operator<<
              (&local_c8,
               (char (*) [114])
               "Expected: reader.ReportError(\"a{}c\", \'b\') throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    if (local_b8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8) {
      operator_delete(local_b8[0].ptr_,local_a8[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_b8);
  if (local_c8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_c8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x77,message);
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (((local_b8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_b8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_b8[0].ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  freelocale((__locale_t)local_78.locale_.super_Locale.locale_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.super_ReaderBase.name_._M_dataplus._M_p !=
      &local_78.super_ReaderBase.name_.field_2) {
    operator_delete(local_78.super_ReaderBase.name_._M_dataplus._M_p,
                    local_78.super_ReaderBase.name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TextReaderTest, ReportError) {
  TextReader reader("x\n", "test");
  EXPECT_THROW_MSG(reader.ReportError("a{}c", 'b'), mp::ReadError,
                   "test:1:1: abc");
}